

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

action_t __thiscall helics::BrokerBase::commandProcessor(BrokerBase *this,ActionMessage *command)

{
  action_t aVar1;
  string *psVar2;
  uint index;
  action_t aVar3;
  string_view data;
  ActionMessage local_e8;
  
  aVar3 = command->messageAction;
  if ((uint)(aVar3 + (cmd_add_route|cmd_user_disconnect)) < 2) {
    return aVar3;
  }
  if (aVar3 != cmd_ignore) {
    if (aVar3 == cmd_tick) {
      return cmd_tick;
    }
    if (aVar3 == cmd_base_configure) {
      return cmd_base_configure;
    }
    if (aVar3 == cmd_ping) {
      return cmd_ping;
    }
    if (aVar3 == cmd_error_check) {
      return cmd_error_check;
    }
    if (aVar3 == cmd_multi_message) {
      index = 0;
      aVar3 = cmd_multi_message;
      while (index < command->counter) {
        local_e8.messageAction = cmd_ignore;
        local_e8.messageID = 0;
        local_e8.source_id.gid = 0;
        local_e8.source_handle.hid = -1700000000;
        local_e8.dest_id.gid = 0;
        local_e8.dest_handle.hid = -1700000000;
        local_e8.payload.buffer._M_elems[0x38] = 0;
        local_e8.payload.buffer._M_elems[0x39] = 0;
        local_e8.payload.buffer._M_elems[0x3a] = 0;
        local_e8.payload.buffer._M_elems[0x3b] = 0;
        local_e8.payload.buffer._M_elems[0x3c] = 0;
        local_e8.payload.buffer._M_elems[0x3d] = 0;
        local_e8.payload.buffer._M_elems[0x3e] = 0;
        local_e8.payload.buffer._M_elems[0x3f] = 0;
        local_e8.payload.bufferSize = 0;
        local_e8.payload.buffer._M_elems[0x28] = 0;
        local_e8.payload.buffer._M_elems[0x29] = 0;
        local_e8.payload.buffer._M_elems[0x2a] = 0;
        local_e8.payload.buffer._M_elems[0x2b] = 0;
        local_e8.payload.buffer._M_elems[0x2c] = 0;
        local_e8.payload.buffer._M_elems[0x2d] = 0;
        local_e8.payload.buffer._M_elems[0x2e] = 0;
        local_e8.payload.buffer._M_elems[0x2f] = 0;
        local_e8.payload.buffer._M_elems[0x30] = 0;
        local_e8.payload.buffer._M_elems[0x31] = 0;
        local_e8.payload.buffer._M_elems[0x32] = 0;
        local_e8.payload.buffer._M_elems[0x33] = 0;
        local_e8.payload.buffer._M_elems[0x34] = 0;
        local_e8.payload.buffer._M_elems[0x35] = 0;
        local_e8.payload.buffer._M_elems[0x36] = 0;
        local_e8.payload.buffer._M_elems[0x37] = 0;
        local_e8.payload.buffer._M_elems[0x18] = 0;
        local_e8.payload.buffer._M_elems[0x19] = 0;
        local_e8.payload.buffer._M_elems[0x1a] = 0;
        local_e8.payload.buffer._M_elems[0x1b] = 0;
        local_e8.payload.buffer._M_elems[0x1c] = 0;
        local_e8.payload.buffer._M_elems[0x1d] = 0;
        local_e8.payload.buffer._M_elems[0x1e] = 0;
        local_e8.payload.buffer._M_elems[0x1f] = 0;
        local_e8.payload.buffer._M_elems[0x20] = 0;
        local_e8.payload.buffer._M_elems[0x21] = 0;
        local_e8.payload.buffer._M_elems[0x22] = 0;
        local_e8.payload.buffer._M_elems[0x23] = 0;
        local_e8.payload.buffer._M_elems[0x24] = 0;
        local_e8.payload.buffer._M_elems[0x25] = 0;
        local_e8.payload.buffer._M_elems[0x26] = 0;
        local_e8.payload.buffer._M_elems[0x27] = 0;
        local_e8.payload.buffer._M_elems[8] = 0;
        local_e8.payload.buffer._M_elems[9] = 0;
        local_e8.payload.buffer._M_elems[10] = 0;
        local_e8.payload.buffer._M_elems[0xb] = 0;
        local_e8.payload.buffer._M_elems[0xc] = 0;
        local_e8.payload.buffer._M_elems[0xd] = 0;
        local_e8.payload.buffer._M_elems[0xe] = 0;
        local_e8.payload.buffer._M_elems[0xf] = 0;
        local_e8.payload.buffer._M_elems[0x10] = 0;
        local_e8.payload.buffer._M_elems[0x11] = 0;
        local_e8.payload.buffer._M_elems[0x12] = 0;
        local_e8.payload.buffer._M_elems[0x13] = 0;
        local_e8.payload.buffer._M_elems[0x14] = 0;
        local_e8.payload.buffer._M_elems[0x15] = 0;
        local_e8.payload.buffer._M_elems[0x16] = 0;
        local_e8.payload.buffer._M_elems[0x17] = 0;
        local_e8.Tso.internalTimeCode = 0;
        local_e8.payload.buffer._M_elems[0] = 0;
        local_e8.payload.buffer._M_elems[1] = 0;
        local_e8.payload.buffer._M_elems[2] = 0;
        local_e8.payload.buffer._M_elems[3] = 0;
        local_e8.payload.buffer._M_elems[4] = 0;
        local_e8.payload.buffer._M_elems[5] = 0;
        local_e8.payload.buffer._M_elems[6] = 0;
        local_e8.payload.buffer._M_elems[7] = 0;
        local_e8.Te.internalTimeCode = 0;
        local_e8.Tdemin.internalTimeCode = 0;
        local_e8.counter = 0;
        local_e8.flags = 0;
        local_e8.sequenceID = 0;
        local_e8.actionTime.internalTimeCode = 0;
        local_e8.payload.bufferCapacity = 0x40;
        local_e8.payload.heap = (byte *)&local_e8.payload;
        local_e8.stringData.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.stringData.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_e8.payload.nonOwning = false;
        local_e8.payload.locked = false;
        local_e8.payload.usingAllocatedBuffer = false;
        local_e8.payload.errorCondition = '\0';
        local_e8.payload.userKey = 0;
        local_e8.stringData.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        psVar2 = ActionMessage::getString_abi_cxx11_(command,index);
        data._M_str = (psVar2->_M_dataplus)._M_p;
        data._M_len = psVar2->_M_string_length;
        ActionMessage::from_string(&local_e8,data);
        aVar1 = commandProcessor(this,&local_e8);
        if (1 < (uint)aVar1) {
          ActionMessage::operator=(command,&local_e8);
          aVar3 = aVar1;
        }
        ActionMessage::~ActionMessage(&local_e8);
        index = index + 1;
        if (1 < (uint)aVar1) {
          return aVar3;
        }
      }
    }
    else if (((this->haltOperations)._M_base._M_i & 1U) == 0) {
      (*this->_vptr_BrokerBase[(ulong)((uint)command->messageAction >> 0x1f) + 5])(this,command);
    }
  }
  return cmd_ignore;
}

Assistant:

action_message_def::action_t BrokerBase::commandProcessor(ActionMessage& command)
{
    switch (command.action()) {
        case CMD_IGNORE:
            break;
        case CMD_TERMINATE_IMMEDIATELY:
        case CMD_STOP:
        case CMD_TICK:
        case CMD_BASE_CONFIGURE:
        case CMD_PING:
        case CMD_ERROR_CHECK:
            return command.action();
        case CMD_MULTI_MESSAGE:
            for (int ii = 0; ii < command.counter; ++ii) {
                ActionMessage NMess;
                NMess.from_string(command.getString(ii));
                auto commandAction = commandProcessor(NMess);
                if (commandAction != CMD_IGNORE) {
                    // overwrite the abort command but ignore ticks in a multi-message context
                    // they shouldn't be there
                    if (commandAction != CMD_TICK) {
                        command = NMess;
                        return commandAction;
                    }
                }
            }
            break;
        default:
            if (!haltOperations) {
                if (isPriorityCommand(command)) {
                    processPriorityCommand(std::move(command));
                } else {
                    processCommand(std::move(command));
                }
            }
    }
    return CMD_IGNORE;
}